

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void nullcDumpStackData(void)

{
  ExternTypeInfo *pEVar1;
  uint uVar2;
  long lVar3;
  ExternLocalInfo *pEVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  ExternTypeInfo *pEVar9;
  char *pcVar10;
  ExternFuncInfo *pEVar11;
  int iVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ExternVarInfo *pEVar15;
  uint variableCount;
  uint functionCount;
  uint codeTypeCount;
  uint dataCount;
  char buf [1024];
  uint local_4ac;
  uint local_494;
  long local_490;
  void *local_488;
  ExternFuncInfo *local_480;
  uint local_474;
  ExternVarInfo *local_470;
  ExternLocalInfo *local_468;
  ExternTypeInfo *local_460;
  ExternLocalInfo *local_458;
  ExternFuncInfo *local_450;
  ulong local_448;
  uint local_440 [2];
  char local_438 [1032];
  
  local_440[1] = 0xffffffff;
  pvVar8 = nullcGetVariableData(local_440 + 1);
  local_494 = 0;
  local_470 = nullcDebugVariableInfo(&local_494);
  local_440[0] = 0;
  pEVar9 = nullcDebugTypeInfo(local_440);
  local_474 = 0;
  local_450 = nullcDebugFunctionInfo(&local_474);
  local_458 = nullcDebugLocalInfo((uint *)0x0);
  pcVar10 = nullcDebugSymbols((uint *)0x0);
  nullcDebugBeginCallStack();
  uVar5 = nullcDebugGetStackFrame();
  if (uVar5 != 0) {
    local_470 = (ExternVarInfo *)&local_470->offset;
    local_4ac = 0;
    local_488 = pvVar8;
    do {
      PrintStackFrame(uVar5,local_438,0x400,false);
      printf("%s",local_438);
      pEVar11 = nullcDebugConvertAddressToFunction(uVar5,local_450,local_474);
      if (pEVar11 == (ExternFuncInfo *)0x0) {
        if (local_494 != 0) {
          uVar14 = 0;
          pEVar15 = local_470;
          do {
            uVar5 = *(uint *)((long)pEVar15 + -4);
            pEVar1 = pEVar9 + uVar5;
            printf("  ");
            printf("%p: %s %s",(ulong)pEVar15->offsetToName + (long)pvVar8,
                   pcVar10 + pEVar9[uVar5].offsetToName,
                   pcVar10 + ((ExternVarInfo *)((long)pEVar15 + -0xc))->offsetToName);
            if ((pEVar9[uVar5].subCat & ~CAT_POINTER) == CAT_NONE) {
              printf(" = ");
              nullcPrintBasicVariableInfo
                        (pEVar1,(char *)((ulong)pEVar15->offsetToName + (long)pvVar8));
              putchar(10);
            }
            else {
              iVar12 = strcmp(pcVar10 + pEVar1->offsetToName,"typeid");
              if (iVar12 == 0) {
                printf(" = %s\n",
                       pcVar10 + pEVar9[*(int *)((long)pvVar8 + (ulong)pEVar15->offsetToName)].
                                 offsetToName);
              }
              else {
                putchar(10);
                nullcPrintVariableInfo
                          (pEVar1,(char *)((ulong)pEVar15->offsetToName + (long)pvVar8),2);
              }
            }
            uVar5 = pEVar1->size + pEVar15->offsetToName;
            if (local_4ac < uVar5) {
              local_4ac = uVar5;
            }
            uVar14 = uVar14 + 1;
            pEVar15 = (ExternVarInfo *)((long)pEVar15 + 0x10);
          } while (uVar14 < local_494);
        }
      }
      else {
        iVar12 = 0x10 - (local_4ac & 0xf);
        if ((local_4ac & 0xf) == 0) {
          iVar12 = 0;
        }
        local_448 = (ulong)(iVar12 + local_4ac);
        local_490 = local_448 + (long)pvVar8;
        printf("%p: function %s(",local_490,pcVar10 + pEVar11->offsetToName);
        if (pEVar11->paramCount != 0) {
          uVar5 = 0;
          do {
            uVar6 = pEVar11->offsetToFirstLocal + uVar5;
            printf("%s %s",pcVar10 + pEVar9[local_458[uVar6].type].offsetToName,
                   pcVar10 + local_458[uVar6].offsetToName);
            uVar6 = pEVar11->paramCount;
            if (uVar5 != uVar6 - 1) {
              printf(", ");
              uVar6 = pEVar11->paramCount;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < uVar6);
        }
        uVar5 = pEVar11->stackSize;
        printf(") argument size %u, stack size %u\n",(ulong)pEVar11->argumentSize);
        if (pEVar11->localCount != 0) {
          uVar6 = 0;
          local_480 = pEVar11;
          do {
            pEVar4 = local_458;
            uVar7 = local_480->offsetToFirstLocal + uVar6;
            local_468 = local_458 + uVar7;
            uVar2 = local_458[uVar7].type;
            local_460 = pEVar9 + uVar2;
            printf("  ");
            lVar3 = local_490;
            printf("%p: %s %s",(ulong)pEVar4[uVar7].offset + local_490,
                   pcVar10 + pEVar9[pEVar4[uVar7].type].offsetToName);
            pEVar1 = local_460;
            pEVar4 = local_468;
            if ((pEVar9[uVar2].subCat & ~CAT_POINTER) == CAT_NONE) {
              printf(" = ");
              nullcPrintBasicVariableInfo(local_460,(char *)((ulong)local_468->offset + lVar3));
              putchar(10);
            }
            else {
              iVar12 = strcmp(pcVar10 + local_460->offsetToName,"typeid");
              if (iVar12 == 0) {
                printf(" = %s\n",
                       pcVar10 + pEVar9[*(int *)(local_490 + (ulong)pEVar4->offset)].offsetToName);
              }
              else {
                putchar(10);
                nullcPrintVariableInfo(pEVar1,(char *)((ulong)pEVar4->offset + local_490),2);
              }
            }
            uVar6 = uVar6 + 1;
            pEVar11 = local_480;
            pvVar8 = local_488;
          } while (uVar6 < local_480->localCount);
        }
        lVar3 = local_490;
        if (pEVar11->parentType != 0xffffffff) {
          puVar13 = (undefined8 *)(local_490 + (ulong)pEVar11->argumentSize + -8);
          printf("  ");
          printf("%p: %s %s = %p\n",puVar13,"$this",
                 pcVar10 + pEVar9[pEVar11->parentType].offsetToName,*puVar13);
        }
        if (pEVar11->contextType != 0xffffffff) {
          puVar13 = (undefined8 *)(lVar3 + (ulong)pEVar11->argumentSize + -8);
          printf("  ");
          printf("%p: %s %s = %p\n",puVar13,"$context",
                 pcVar10 + pEVar9[pEVar11->contextType].offsetToName,*puVar13);
        }
        local_4ac = (uVar5 + 0xf & 0xfffffff0) + (int)local_448;
      }
      uVar5 = nullcDebugGetStackFrame();
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void nullcDumpStackData()
{
	unsigned dataCount = ~0u;
	char *data = (char*)nullcGetVariableData(&dataCount);

	unsigned variableCount = 0;
	ExternVarInfo *codeVars = nullcDebugVariableInfo(&variableCount);

	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	unsigned functionCount = 0;
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(&functionCount);

	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);
	char *codeSymbols = nullcDebugSymbols(NULL);

	unsigned offset = 0;

	nullcDebugBeginCallStack();
	while(unsigned address = nullcDebugGetStackFrame())
	{
		char buf[1024];
		PrintStackFrame(address, buf, 1024, false);

		printf("%s", buf);

		ExternFuncInfo *func = nullcDebugConvertAddressToFunction(address, codeFunctions, functionCount);

		unsigned indent = 1;

		if(func)
		{
			ExternFuncInfo &function = *func;

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;

			printf("%p: function %s(", (void*)(data + offset), codeSymbols + function.offsetToName);
			for(unsigned arg = 0; arg < function.paramCount; arg++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + arg];
				printf("%s %s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);
				if(arg != function.paramCount - 1)
					printf(", ");
			}

			unsigned argumentsSize = function.argumentSize;
			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			printf(") argument size %u, stack size %u\n", argumentsSize, stackSize);

			for(unsigned i = 0; i < function.localCount; i++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + i];
				ExternTypeInfo &localType = codeTypes[lInfo.type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + offset + lInfo.offset), codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);

				if(localType.subCat == ExternTypeInfo::CAT_NONE || localType.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(localType, data + offset + lInfo.offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + localType.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + offset + lInfo.offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(localType, data + offset + lInfo.offset, indent + 1);
				}
			}

			if(function.parentType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$this", codeSymbols + codeTypes[function.parentType].offsetToName, *(void**)ptr);
			}

			if(function.contextType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$context", codeSymbols + codeTypes[function.contextType].offsetToName, *(void**)ptr);
			}

			offset += stackSize;
		}
		else
		{
			for(unsigned i = 0; i < variableCount; i++)
			{
				ExternTypeInfo &type = codeTypes[codeVars[i].type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + codeVars[i].offset), codeSymbols + type.offsetToName, codeSymbols + codeVars[i].offsetToName);

				if(type.subCat == ExternTypeInfo::CAT_NONE || type.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(type, data + codeVars[i].offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + codeVars[i].offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(type, data + codeVars[i].offset, indent + 1);
				}

				if(codeVars[i].offset + type.size > offset)
					offset = codeVars[i].offset + type.size;
			}
		}
	}
}